

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  int iVar1;
  ulong in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  int local_a0;
  bool local_9b;
  char local_9a;
  char local_99;
  uchar header_1;
  uchar *puStack_98;
  uchar header;
  uchar *prev;
  uchar *puStack_88;
  int diff;
  uchar *begin;
  long lStack_78;
  int len;
  uchar *row;
  int k;
  int j;
  int i;
  int format;
  int colorbytes;
  int has_alpha;
  void *data_local;
  int local_48;
  int comp_local;
  int y_local;
  int x_local;
  stbi__write_context *s_local;
  
  local_9b = comp == 2 || comp == 4;
  format = (int)local_9b;
  local_a0 = comp;
  if (format != 0) {
    local_a0 = comp + -1;
  }
  i = local_a0;
  j = 2;
  if (local_a0 < 2) {
    j = 3;
  }
  if ((y < 0) || (x < 0)) {
    s_local._4_4_ = 0;
  }
  else {
    _colorbytes = data;
    data_local._4_4_ = comp;
    local_48 = y;
    comp_local = x;
    _y_local = s;
    if (stbi_write_tga_with_rle == 0) {
      s_local._4_4_ =
           stbiw__outfile(s,-1,-1,x,y,comp,0,data,format,0,"111 221 2222 11",0,0,j,0,0,0,0,0,x,y,
                          (local_a0 + format) * 8,format << 3);
    }
    else {
      stbiw__writef(s,"111 221 2222 11",0,0,(ulong)(j + 8),0,0,
                    in_stack_fffffffffffffed0 & 0xffffffff00000000,0,0,
                    CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),x),y,
                    (local_a0 + format) * 8,format << 3);
      row._4_4_ = local_48;
      while (row._4_4_ = row._4_4_ + -1, -1 < row._4_4_) {
        lStack_78 = (long)_colorbytes + (long)(row._4_4_ * comp_local * data_local._4_4_);
        for (k = 0; k < comp_local; k = begin._4_4_ + k) {
          puStack_88 = (uchar *)(lStack_78 + k * data_local._4_4_);
          prev._4_4_ = 1;
          begin._4_4_ = 1;
          if (k < comp_local + -1) {
            begin._4_4_ = 2;
            prev._4_4_ = memcmp(puStack_88,(void *)(lStack_78 + (k + 1) * data_local._4_4_),
                                (long)data_local._4_4_);
            if (prev._4_4_ == 0) {
              row._0_4_ = k + 2;
              while (((int)row < comp_local && begin._4_4_ < 0x80 &&
                     (iVar1 = memcmp(puStack_88,(void *)(lStack_78 + (int)row * data_local._4_4_),
                                     (long)data_local._4_4_), iVar1 == 0))) {
                begin._4_4_ = begin._4_4_ + 1;
                row._0_4_ = (int)row + 1;
              }
            }
            else {
              puStack_98 = puStack_88;
              for (row._0_4_ = k + 2; (int)row < comp_local && begin._4_4_ < 0x80;
                  row._0_4_ = (int)row + 1) {
                iVar1 = memcmp(puStack_98,(void *)(lStack_78 + (int)row * data_local._4_4_),
                               (long)data_local._4_4_);
                if (iVar1 == 0) {
                  begin._4_4_ = begin._4_4_ + -1;
                  break;
                }
                puStack_98 = puStack_98 + data_local._4_4_;
                begin._4_4_ = begin._4_4_ + 1;
              }
            }
          }
          if (prev._4_4_ == 0) {
            local_9a = (char)begin._4_4_ + '\x7f';
            (*_y_local->func)(_y_local->context,&local_9a,1);
            stbiw__write_pixel(_y_local,-1,data_local._4_4_,format,0,puStack_88);
          }
          else {
            local_99 = (char)begin._4_4_ + -1;
            (*_y_local->func)(_y_local->context,&local_99,1);
            for (row._0_4_ = 0; (int)row < begin._4_4_; row._0_4_ = (int)row + 1) {
              stbiw__write_pixel(_y_local,-1,data_local._4_4_,format,0,
                                 puStack_88 + (int)row * data_local._4_4_);
            }
          }
        }
      }
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      for (j = y - 1; j >= 0; --j) {
          unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = (unsigned char) (len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = (unsigned char) (len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}